

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  size_t sVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  Result RVar5;
  pointer __p;
  pointer *__ptr;
  Enum EVar6;
  __off64_t *in_R8;
  size_t in_R9;
  long lVar7;
  Expr *in_stack_fffffffffffffee8;
  Expr *pEVar8;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  Var var;
  _Head_base<0UL,_wabt::Expr_*,_false> local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  intrusive_list<wabt::Expr> *local_88;
  _Head_base<0UL,_wabt::Expr_*,_false> local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_78;
  _Head_base<0UL,_wabt::Expr_*,_false> local_70;
  _Head_base<0UL,_wabt::Expr_*,_false> local_68;
  _Head_base<0UL,_wabt::Expr_*,_false> local_60;
  Location loc;
  
  TVar3 = Peek(this,0);
  RVar5.enum_ = Error;
  if (TVar3 != Lpar) {
    return (Result)Error;
  }
  TVar3 = Peek(this,1);
  bVar2 = anon_unknown_1::IsPlainInstr(TVar3);
  if (bVar2) {
    Consume((Token *)&var,this);
    local_a8._M_head_impl = (Expr *)0x0;
    RVar4 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_a8);
    if ((RVar4.enum_ == Error) || (RVar4 = ParseExprList(this,exprs), RVar4.enum_ == Error)) {
      bVar2 = false;
    }
    else {
      local_88 = exprs;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&var,"an expr",(allocator<char> *)&stack0xfffffffffffffee8);
      loc.filename._M_len = 0;
      loc.filename._M_str = (char *)0x0;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&loc,&var,
                 &var.type_);
      bVar2 = false;
      RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&loc,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&loc);
      std::__cxx11::string::_M_dispose();
      if (RVar4.enum_ != Error) {
        local_60._M_head_impl = local_a8._M_head_impl;
        local_a8._M_head_impl = (Expr *)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (local_88,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_60);
        if (local_60._M_head_impl != (Expr *)0x0) {
          (*(local_60._M_head_impl)->_vptr_Expr[1])();
        }
        local_60._M_head_impl = (Expr *)0x0;
        bVar2 = true;
      }
    }
    if (local_a8._M_head_impl != (Expr *)0x0) {
      (*(local_a8._M_head_impl)->_vptr_Expr[1])();
    }
joined_r0x00134684:
    if (!bVar2) {
      return (Result)RVar5.enum_;
    }
LAB_001346d8:
    RVar5 = Expect(this,Rpar);
    EVar6 = (Enum)(RVar5.enum_ == Error);
  }
  else {
    GetLocation(&loc,this);
    TVar3 = Peek(this,1);
    if (TVar3 == Try) {
      Consume((Token *)&var,this);
      Consume((Token *)&var,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&var);
      std::make_unique<wabt::TryExpr,wabt::Location&>((Location *)&stack0xfffffffffffffee8);
      RVar5 = ParseLabelOpt(this,(string *)(in_stack_fffffffffffffee8 + 1));
      if (((((RVar5.enum_ == Error) ||
            (RVar5 = ParseBlockDeclaration
                               (this,(BlockDeclaration *)
                                     &in_stack_fffffffffffffee8[1].loc.filename._M_str),
            RVar5.enum_ == Error)) || (RVar5 = Expect(this,Lpar), RVar5.enum_ == Error)) ||
          ((RVar5 = Expect(this,Do), RVar5.enum_ == Error ||
           (RVar5 = ParseInstrList(this,(ExprList *)
                                        &in_stack_fffffffffffffee8[5].
                                         super_intrusive_list_base<wabt::Expr>.prev_),
           RVar5.enum_ == Error)))) || (RVar5 = Expect(this,Rpar), RVar5.enum_ == Error))
      goto LAB_001345f2;
      TVar3 = Peek(this,0);
      if (TVar3 == Lpar) {
        Consume((Token *)&var,this);
        TVar3 = Peek(this,0);
        if (TVar3 - Catch < 2) {
          RVar5 = ParseCatchExprList(this,(CatchVector *)
                                          &in_stack_fffffffffffffee8[6].
                                           super_intrusive_list_base<wabt::Expr>);
          if (RVar5.enum_ == Error) goto LAB_001345f2;
          *(undefined4 *)&in_stack_fffffffffffffee8->field_0x3c = 1;
          goto LAB_00134aaa;
        }
        if (TVar3 != Delegate) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&var,"catch",&local_10b);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&var.type_,"catch_all",&local_109);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)((long)&var.field_2 + 0x18),"delegate",&local_10a);
          local_a8._M_head_impl = (Expr *)0x0;
          uStack_a0 = 0;
          local_98 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     &var,&local_a8);
          ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a8,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
          lVar7 = 0x40;
          do {
            std::__cxx11::string::_M_dispose();
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != -0x20);
          goto LAB_00134aaa;
        }
        Consume((Token *)&var,this);
        Var::Var(&var);
        RVar5 = ParseVar(this,&var);
        if (RVar5.enum_ == Error) {
          Var::~Var(&var);
        }
        else {
          Var::operator=((Var *)&in_stack_fffffffffffffee8[6].loc.filename._M_str,&var);
          *(undefined4 *)&in_stack_fffffffffffffee8->field_0x3c = 2;
          RVar5 = Expect(this,Rpar);
          Var::~Var(&var);
          if (RVar5.enum_ != Error) goto LAB_00134aaa;
        }
LAB_001345f2:
        bVar2 = false;
        pEVar8 = in_stack_fffffffffffffee8;
      }
      else {
LAB_00134aaa:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&var,"a valid try clause",&local_10b);
        local_a8._M_head_impl = (Expr *)0x0;
        uStack_a0 = 0;
        local_98 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                   &var,&var.type_);
        bVar2 = false;
        RVar5 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_a8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
        std::__cxx11::string::_M_dispose();
        pEVar8 = in_stack_fffffffffffffee8;
        if (RVar5.enum_ != Error) {
          GetLocation(&var.loc,this);
          *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
           &in_stack_fffffffffffffee8[5].type_ = var.loc.field_1.field_1.offset;
          in_stack_fffffffffffffee8[6]._vptr_Expr = (_func_int **)var.loc.field_1._8_8_;
          in_stack_fffffffffffffee8[5].loc.field_1.field_1.offset = var.loc.filename._M_len;
          *(char **)((long)&in_stack_fffffffffffffee8[5].loc.field_1 + 8) = var.loc.filename._M_str;
          pEVar8 = (Expr *)0x0;
          local_80._M_head_impl = in_stack_fffffffffffffee8;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_80);
          if (local_80._M_head_impl != (Expr *)0x0) {
            (*(local_80._M_head_impl)->_vptr_Expr[1])();
          }
          local_80._M_head_impl = (Expr *)0x0;
          bVar2 = true;
        }
      }
      if (pEVar8 != (Expr *)0x0) {
        (*pEVar8->_vptr_Expr[1])();
      }
      if (bVar2) goto LAB_001346d8;
    }
    else {
      if (TVar3 == If) {
        Consume((Token *)&var,this);
        Consume((Token *)&var,this);
        std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)&stack0xfffffffffffffee8);
        RVar4 = ParseLabelOpt(this,(string *)(in_stack_fffffffffffffee8 + 1));
        RVar5.enum_ = Error;
        if ((RVar4.enum_ == Error) ||
           (RVar4 = ParseBlockDeclaration
                              (this,(BlockDeclaration *)
                                    &in_stack_fffffffffffffee8[1].loc.filename._M_str),
           RVar4.enum_ == Error)) {
LAB_0013466f:
          bVar2 = false;
          pEVar8 = in_stack_fffffffffffffee8;
        }
        else {
          bVar2 = PeekMatchExpr(this);
          if (bVar2) {
            var.loc.filename._M_len = 0;
            var.loc.filename._M_str = (char *)0x0;
            var.loc.field_1.field_1.offset =
                 (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
            RVar4 = ParseExpr(this,(ExprList *)&var);
            if (RVar4.enum_ == Error) {
              intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)&var);
              goto LAB_0013466f;
            }
            intrusive_list<wabt::Expr>::splice
                      (exprs,(int)exprs,(__off64_t *)0x0,(int)&var,in_R8,in_R9,
                       (uint)in_stack_fffffffffffffee8);
            intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)&var);
          }
          bVar2 = MatchLpar(this,Then);
          if (!bVar2) {
            bVar2 = PeekMatchExpr(this);
            if (bVar2) {
              RVar4 = ParseExpr(this,(ExprList *)
                                     &in_stack_fffffffffffffee8[5].
                                      super_intrusive_list_base<wabt::Expr>.prev_);
              if (RVar4.enum_ != Error) {
                GetLocation(&var.loc,this);
                *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
                 &in_stack_fffffffffffffee8[5].type_ = var.loc.field_1.field_1.offset;
                in_stack_fffffffffffffee8[6]._vptr_Expr = (_func_int **)var.loc.field_1._8_8_;
                in_stack_fffffffffffffee8[5].loc.field_1.field_1.offset = var.loc.filename._M_len;
                *(char **)((long)&in_stack_fffffffffffffee8[5].loc.field_1 + 8) =
                     var.loc.filename._M_str;
                bVar2 = PeekMatchExpr(this);
                if (!bVar2) goto LAB_00134990;
LAB_00134954:
                RVar4 = ParseExpr(this,(ExprList *)
                                       &in_stack_fffffffffffffee8[6].
                                        super_intrusive_list_base<wabt::Expr>);
LAB_0013495c:
                if (RVar4.enum_ != Error) goto LAB_00134965;
              }
            }
            else {
              ConsumeIfLpar(this);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&var,"then block",&local_10b);
              local_a8._M_head_impl = (Expr *)0x0;
              uStack_a0 = 0;
              local_98 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_a8,&var,&var.type_);
              RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&local_a8,"(then ...)");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_a8);
              std::__cxx11::string::_M_dispose();
            }
            goto LAB_0013466f;
          }
          RVar4 = ParseTerminatingInstrList
                            (this,(ExprList *)
                                  &in_stack_fffffffffffffee8[5].
                                   super_intrusive_list_base<wabt::Expr>.prev_);
          if (RVar4.enum_ == Error) goto LAB_0013466f;
          GetLocation(&var.loc,this);
          *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
           &in_stack_fffffffffffffee8[5].type_ = var.loc.field_1.field_1.offset;
          in_stack_fffffffffffffee8[6]._vptr_Expr = (_func_int **)var.loc.field_1._8_8_;
          in_stack_fffffffffffffee8[5].loc.field_1.field_1.offset = var.loc.filename._M_len;
          *(char **)((long)&in_stack_fffffffffffffee8[5].loc.field_1 + 8) = var.loc.filename._M_str;
          RVar4 = Expect(this,Rpar);
          if (RVar4.enum_ == Error) goto LAB_0013466f;
          bVar2 = MatchLpar(this,Else);
          if (bVar2) {
            RVar4 = ParseTerminatingInstrList
                              (this,(ExprList *)
                                    &in_stack_fffffffffffffee8[6].
                                     super_intrusive_list_base<wabt::Expr>);
            if (RVar4.enum_ != Error) {
              RVar4 = Expect(this,Rpar);
              goto LAB_0013495c;
            }
            goto LAB_0013466f;
          }
          bVar2 = PeekMatchExpr(this);
          if (bVar2) goto LAB_00134954;
LAB_00134965:
          GetLocation(&var.loc,this);
          ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
          ((long)&in_stack_fffffffffffffee8[6].loc.field_1 + 8))->offset =
               (size_t)var.loc.field_1.field_1.offset;
          *(undefined8 *)&in_stack_fffffffffffffee8[6].type_ = var.loc.field_1._8_8_;
          in_stack_fffffffffffffee8[6].loc.filename._M_str = (char *)var.loc.filename._M_len;
          in_stack_fffffffffffffee8[6].loc.field_1.field_1.offset = (size_t)var.loc.filename._M_str;
LAB_00134990:
          pEVar8 = (Expr *)0x0;
          local_78._M_head_impl = in_stack_fffffffffffffee8;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_78);
          if (local_78._M_head_impl != (Expr *)0x0) {
            (*(local_78._M_head_impl)->_vptr_Expr[1])();
          }
          local_78._M_head_impl = (Expr *)0x0;
          bVar2 = true;
        }
        if (pEVar8 != (Expr *)0x0) {
          (*pEVar8->_vptr_Expr[1])();
        }
        goto joined_r0x00134684;
      }
      if (TVar3 == Loop) {
        Consume((Token *)&var,this);
        Consume((Token *)&var,this);
        std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>(&var.loc);
        RVar5 = ParseLabelOpt(this,(string *)(var.loc.filename._M_len + 0x40));
        if ((RVar5.enum_ != Error) &&
           (RVar5 = ParseBlock(this,(Block *)(var.loc.filename._M_len + 0x40)),
           sVar1 = var.loc.filename._M_len, RVar5.enum_ != Error)) {
          var.loc.filename._M_len = 0;
          local_70._M_head_impl = (Expr *)sVar1;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_70);
          if (local_70._M_head_impl != (Expr *)0x0) {
            (*(local_70._M_head_impl)->_vptr_Expr[1])();
          }
          local_70._M_head_impl = (Expr *)0x0;
          goto LAB_001346c0;
        }
LAB_0013453d:
        bVar2 = false;
      }
      else {
        if (TVar3 != Block) {
          __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0xc0f,"Result wabt::WastParser::ParseExpr(ExprList *)");
        }
        Consume((Token *)&var,this);
        Consume((Token *)&var,this);
        std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>(&var.loc);
        RVar5 = ParseLabelOpt(this,(string *)(var.loc.filename._M_len + 0x40));
        if ((RVar5.enum_ == Error) ||
           (RVar5 = ParseBlock(this,(Block *)(var.loc.filename._M_len + 0x40)),
           sVar1 = var.loc.filename._M_len, RVar5.enum_ == Error)) goto LAB_0013453d;
        var.loc.filename._M_len = 0;
        local_68._M_head_impl = (Expr *)sVar1;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_68);
        if (local_68._M_head_impl != (Expr *)0x0) {
          (*(local_68._M_head_impl)->_vptr_Expr[1])();
        }
        local_68._M_head_impl = (Expr *)0x0;
LAB_001346c0:
        bVar2 = true;
      }
      if (var.loc.filename._M_len != 0) {
        (**(code **)(*(long *)var.loc.filename._M_len + 8))();
      }
      if (bVar2) goto LAB_001346d8;
    }
    EVar6 = Error;
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}